

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O0

bool __thiscall Search::excludeFileByContent(Search *this,string *path)

{
  text_style ts;
  string_view sVar1;
  string_view fmt;
  FILE *pFVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  FILE *pFVar6;
  int *piVar7;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt_00;
  format_args args;
  allocator local_801;
  string local_800;
  undefined8 local_7e0;
  size_t sz;
  char buf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  color_type local_3a8;
  text_style local_3a0;
  styled_arg<char[7]> local_388;
  v10 *local_368;
  char *local_360;
  _func_void__IO_FILE_ptr *local_358;
  allocator local_349;
  string local_348 [55];
  allocator local_311;
  string local_310 [32];
  undefined1 local_2f0 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  bool rval;
  string *path_local;
  Search *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  size_t local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  string *local_270;
  styled_arg<char[7]> *local_268;
  FILE *local_260;
  v10 *local_258;
  char *pcStack_250;
  char *local_248;
  v10 **local_240;
  format_args local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  size_t local_220;
  format_args local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  size_t local_200;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f8 [3];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  FILE *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  size_t sStack_1c0;
  char *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  undefined1 local_170 [16];
  v10 *local_160;
  char *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  string *local_148;
  styled_arg<char[7]> *local_140;
  v10 *local_138;
  char *pcStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  size_t sStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  size_t sStack_f0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_e8;
  format_args *local_e0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d8;
  format_args *local_d0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_c8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_c0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_b8;
  undefined8 local_b0;
  format_args *local_a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a0;
  undefined8 local_98;
  format_args *local_90;
  char *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  char *local_78;
  v10 **local_70;
  char *local_68;
  v10 **local_60;
  v10 *local_58;
  char *pcStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  char *local_10;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._7_1_ = 0;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,pcVar5,&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"r",&local_349);
  pFVar6 = Utils::fopen((char *)local_310,(char *)local_348);
  local_358 = fclose;
  std::unique_ptr<_IO_FILE,void(*)(_IO_FILE*)>::unique_ptr<void(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,void(*)(_IO_FILE*)> *)local_2f0,(pointer)pFVar6,&local_358);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_2f0);
  pFVar2 = _stderr;
  if (bVar4) {
    while( true ) {
      bVar4 = false;
      if ((f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
           super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ & 1) == 0) {
        pFVar6 = (FILE *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_2f0);
        pcVar5 = fgets((char *)&sz,0x400,pFVar6);
        bVar4 = pcVar5 != (char *)0x0;
      }
      if (!bVar4) break;
      local_7e0 = strlen((char *)&sz);
      while( true ) {
        sVar3 = local_7e0;
        bVar4 = false;
        if ((local_7e0 != 0) && (bVar4 = true, *(char *)((long)&local_7e0 + local_7e0 + 7) != '\n'))
        {
          bVar4 = *(char *)((long)&local_7e0 + local_7e0 + 7) == '\r';
        }
        if (!bVar4) break;
        local_7e0 = local_7e0 - 1;
        *(undefined1 *)((long)&local_7e0 + sVar3 + 7) = 0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_800,(char *)&sz,&local_801);
      f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ =
           Filter::excludeContent(&this->_filter,&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      std::allocator<char>::~allocator((allocator<char> *)&local_801);
    }
  }
  else {
    local_240 = &local_368;
    local_248 = "{} Failed to open file {} : {}";
    local_78 = "{} Failed to open file {} : {}";
    local_368 = (v10 *)0x172869;
    local_70 = local_240;
    local_360 = (char *)std::char_traits<char>::length("{} Failed to open file {} : {}");
    local_10 = local_248;
    ::fmt::v10::detail::color_type::color_type(&local_3a8,red);
    ::fmt::v10::fg(&local_3a0,local_3a8);
    ts.background_color = local_3a0.background_color;
    ts.foreground_color = local_3a0.foreground_color;
    ts.set_foreground_color = local_3a0.set_foreground_color;
    ts.set_background_color = local_3a0.set_background_color;
    ts.ems = local_3a0.ems;
    ts._19_1_ = local_3a0._19_1_;
    ::fmt::v10::styled<char[7]>(&local_388,(char (*) [7])"ERROR:",ts);
    piVar7 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)&local_3c8,*piVar7);
    local_258 = local_368;
    pcStack_250 = local_360;
    local_260 = pFVar2;
    local_268 = &local_388;
    local_278 = &local_3c8;
    local_1b0 = &local_288;
    local_1b8 = "{}\n";
    local_88 = "{}\n";
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17227b;
    local_270 = path;
    local_80 = local_1b0;
    local_280 = std::char_traits<char>::length("{}\n");
    local_68 = local_1b8;
    local_128 = &local_2a8;
    local_138 = local_258;
    pcStack_130 = pcStack_250;
    local_140 = local_268;
    local_148 = local_270;
    local_150 = local_278;
    local_60 = &local_138;
    local_160 = local_258;
    local_158 = pcStack_250;
    local_58 = local_160;
    pcStack_50 = local_158;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::detail::styled_arg<char[7]>,std::__cxx11::string_const,std::__cxx11::string>
              (&local_1a8,(v10 *)local_268,(styled_arg<char[7]> *)local_270,local_278,local_128);
    local_38 = local_170;
    local_40 = &local_1a8;
    local_28 = 0xddf;
    fmt_00.size_ = 0xddf;
    fmt_00.data_ = local_158;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_40;
    this_00 = local_160;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    ::fmt::v10::vformat_abi_cxx11_(&local_2a8,local_160,fmt_00,args);
    local_1c8 = local_288;
    sStack_1c0 = local_280;
    local_1d0 = pFVar2;
    vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2a8;
    local_1f8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             (vargs,this_00,local_288);
    local_1e0 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_1f8;
    bVar4 = ::fmt::v10::detail::is_utf8();
    if (bVar4) {
      local_120 = &local_1c8;
      local_208 = local_1c8;
      local_200 = sStack_1c0;
      local_d0 = &local_218;
      local_d8 = local_1e0;
      local_c8 = local_1e0;
      local_b0 = 0xd;
      local_b8 = local_1e0;
      local_218.desc_ = 0xd;
      local_218.field_1.values_ = local_1e0;
      fmt.size_ = sStack_1c0;
      fmt.data_ = (char *)local_1c8;
      local_118 = local_208;
      sStack_110 = local_200;
      local_a8 = local_d0;
      ::fmt::v10::vprint(local_1d0,fmt,local_218);
    }
    else {
      local_100 = &local_1c8;
      local_228 = local_1c8;
      local_220 = sStack_1c0;
      local_e0 = &local_238;
      local_e8 = local_1e0;
      local_c0 = local_1e0;
      local_98 = 0xd;
      local_a0 = local_1e0;
      local_238.desc_ = 0xd;
      local_238.field_1.values_ = local_1e0;
      sVar1.size_ = sStack_1c0;
      sVar1.data_ = (char *)local_1c8;
      local_f8 = local_228;
      sStack_f0 = local_220;
      local_90 = local_e0;
      ::fmt::v10::detail::vprint_mojibake(local_1d0,sVar1,local_238);
    }
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_3c8);
  }
  this_local._3_1_ =
       (bool)(f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._7_1_ & 1);
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_2f0);
  return this_local._3_1_;
}

Assistant:

bool Search::excludeFileByContent(std::string const & path) const
{
    bool rval = false;
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return rval;
    }

    char buf[1024];
    while (!rval && fgets(buf, sizeof(buf), f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }
        rval = _filter.excludeContent(buf);
    }
    return rval;
}